

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFRewriteDirectory(TIFF *tif)

{
  ulong diroff;
  int iVar1;
  tmsize_t tVar2;
  toff_t tVar3;
  char *fmt;
  uint64_t nextdir;
  ulong off;
  char *module;
  toff_t tVar4;
  uint16_t dircount;
  uint32_t m;
  undefined4 uStack_3c;
  uint32_t nextnextdir;
  undefined4 uStack_34;
  
  diroff = tif->tif_diroff;
  if (diroff == 0) {
    iVar1 = TIFFWriteDirectory(tif);
    return iVar1;
  }
  if ((tif->tif_flags & 0x80000) == 0) {
    tVar4 = (toff_t)(tif->tif_header).classic.tiff_diroff;
    if (diroff != tVar4) {
      if (diroff >> 0x20 == 0) {
        do {
          iVar1 = _TIFFSeekOK(tif,tVar4);
          if ((iVar1 == 0) ||
             (tVar2 = (*tif->tif_readproc)(tif->tif_clientdata,&dircount,2), tVar2 != 2))
          goto LAB_002734f3;
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabShort(&dircount);
          }
          (*tif->tif_seekproc)(tif->tif_clientdata,(_dircount & 0xffff) * 0xc + (toff_t)tVar4 + 2,0)
          ;
          tVar2 = (*tif->tif_readproc)(tif->tif_clientdata,&nextnextdir,4);
          if (tVar2 != 4) goto LAB_002734fc;
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabLong(&nextnextdir);
          }
          if (tif->tif_diroff == (ulong)nextnextdir) {
            m = 0;
            (*tif->tif_seekproc)
                      (tif->tif_clientdata,(_dircount & 0xffff) * 0xc + (toff_t)tVar4 + 2,0);
            tVar2 = (*tif->tif_writeproc)(tif->tif_clientdata,&m,4);
            if (tVar2 == 4) {
              tif->tif_diroff = 0;
              tif->tif_lastdiroff = 0;
              iVar1 = 3;
            }
            else {
              TIFFErrorExtR(tif,"TIFFRewriteDirectory","Error writing directory link");
              iVar1 = 1;
            }
          }
          else {
            iVar1 = 0;
            tVar4 = (toff_t)nextnextdir;
          }
        } while (iVar1 == 0);
        if (iVar1 != 3) {
          return 0;
        }
        goto LAB_002733bc;
      }
      fmt = "tif->tif_diroff exceeds 32 bit range allowed for Classic TIFF";
      goto LAB_00273513;
    }
    (tif->tif_header).classic.tiff_diroff = 0;
    tif->tif_diroff = 0;
    (*tif->tif_seekproc)(tif->tif_clientdata,4,0);
    tVar2 = (*tif->tif_writeproc)(tif->tif_clientdata,(void *)((long)&tif->tif_header + 4),4);
    if (tVar2 == 4) goto LAB_002733bc;
  }
  else {
    off = (tif->tif_header).big.tiff_diroff;
    if (off != diroff) {
      do {
        iVar1 = _TIFFSeekOK(tif,off);
        if ((iVar1 == 0) ||
           (tVar2 = (*tif->tif_readproc)(tif->tif_clientdata,&nextnextdir,8), tVar2 != 8))
        goto LAB_002734f3;
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8((uint64_t *)&nextnextdir);
        }
        if (0xffff < CONCAT44(uStack_34,nextnextdir)) {
          fmt = "Sanity check on tag count failed, likely corrupt TIFF";
          goto LAB_00273513;
        }
        tVar4 = CONCAT44(uStack_34,nextnextdir) * 0x14 + off + 8;
        (*tif->tif_seekproc)(tif->tif_clientdata,tVar4,0);
        tVar2 = (*tif->tif_readproc)(tif->tif_clientdata,&m,8);
        if (tVar2 != 8) goto LAB_002734fc;
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8((uint64_t *)&m);
        }
        iVar1 = 0;
        tVar3 = CONCAT44(uStack_3c,m);
        if (CONCAT44(uStack_3c,m) == tif->tif_diroff) {
          _dircount = 0;
          (*tif->tif_seekproc)(tif->tif_clientdata,tVar4,0);
          tVar2 = (*tif->tif_writeproc)(tif->tif_clientdata,&dircount,8);
          tVar3 = off;
          if (tVar2 == 8) {
            tif->tif_diroff = 0;
            tif->tif_lastdiroff = 0;
            iVar1 = 5;
          }
          else {
            TIFFErrorExtR(tif,"TIFFRewriteDirectory","Error writing directory link");
            iVar1 = 1;
          }
        }
        off = tVar3;
      } while (iVar1 == 0);
      if (iVar1 != 5) {
        return 0;
      }
LAB_002733bc:
      _TIFFRemoveEntryFromDirectoryListByOffset(tif,diroff);
      iVar1 = TIFFWriteDirectory(tif);
      return iVar1;
    }
    (tif->tif_header).big.tiff_diroff = 0;
    tif->tif_diroff = 0;
    (*tif->tif_seekproc)(tif->tif_clientdata,8,0);
    tVar2 = (*tif->tif_writeproc)(tif->tif_clientdata,(void *)((long)&tif->tif_header + 8),8);
    if (tVar2 == 8) goto LAB_002733bc;
  }
  module = tif->tif_name;
  fmt = "Error updating TIFF header";
  goto LAB_00273515;
LAB_002734f3:
  fmt = "Error fetching directory count";
  goto LAB_00273513;
LAB_002734fc:
  fmt = "Error fetching directory link";
LAB_00273513:
  module = "TIFFRewriteDirectory";
LAB_00273515:
  TIFFErrorExtR(tif,module,fmt);
  return 0;
}

Assistant:

int TIFFRewriteDirectory(TIFF *tif)
{
    static const char module[] = "TIFFRewriteDirectory";

    /* We don't need to do anything special if it hasn't been written. */
    if (tif->tif_diroff == 0)
        return TIFFWriteDirectory(tif);

    /*
     * Find and zero the pointer to this directory, so that TIFFLinkDirectory
     * will cause it to be added after this directories current pre-link.
     */
    uint64_t torewritediroff = tif->tif_diroff;

    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        if (tif->tif_header.classic.tiff_diroff == tif->tif_diroff)
        {
            tif->tif_header.classic.tiff_diroff = 0;
            tif->tif_diroff = 0;

            TIFFSeekFile(tif, 4, SEEK_SET);
            if (!WriteOK(tif, &(tif->tif_header.classic.tiff_diroff), 4))
            {
                TIFFErrorExtR(tif, tif->tif_name, "Error updating TIFF header");
                return (0);
            }
        }
        else if (tif->tif_diroff > 0xFFFFFFFFU)
        {
            TIFFErrorExtR(tif, module,
                          "tif->tif_diroff exceeds 32 bit range allowed for "
                          "Classic TIFF");
            return (0);
        }
        else
        {
            uint32_t nextdir;
            nextdir = tif->tif_header.classic.tiff_diroff;
            while (1)
            {
                uint16_t dircount;
                uint32_t nextnextdir;

                if (!SeekOK(tif, nextdir) || !ReadOK(tif, &dircount, 2))
                {
                    TIFFErrorExtR(tif, module,
                                  "Error fetching directory count");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(&dircount);
                (void)TIFFSeekFile(tif, nextdir + 2 + dircount * 12, SEEK_SET);
                if (!ReadOK(tif, &nextnextdir, 4))
                {
                    TIFFErrorExtR(tif, module, "Error fetching directory link");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextnextdir);
                if (nextnextdir == tif->tif_diroff)
                {
                    uint32_t m;
                    m = 0;
                    (void)TIFFSeekFile(tif, nextdir + 2 + dircount * 12,
                                       SEEK_SET);
                    if (!WriteOK(tif, &m, 4))
                    {
                        TIFFErrorExtR(tif, module,
                                      "Error writing directory link");
                        return (0);
                    }
                    tif->tif_diroff = 0;
                    /* Force a full-traversal to reach the zeroed pointer */
                    tif->tif_lastdiroff = 0;
                    break;
                }
                nextdir = nextnextdir;
            }
        }
        /* Remove skipped offset from IFD loop directory list. */
        _TIFFRemoveEntryFromDirectoryListByOffset(tif, torewritediroff);
    }
    else
    {
        if (tif->tif_header.big.tiff_diroff == tif->tif_diroff)
        {
            tif->tif_header.big.tiff_diroff = 0;
            tif->tif_diroff = 0;

            TIFFSeekFile(tif, 8, SEEK_SET);
            if (!WriteOK(tif, &(tif->tif_header.big.tiff_diroff), 8))
            {
                TIFFErrorExtR(tif, tif->tif_name, "Error updating TIFF header");
                return (0);
            }
        }
        else
        {
            uint64_t nextdir;
            nextdir = tif->tif_header.big.tiff_diroff;
            while (1)
            {
                uint64_t dircount64;
                uint16_t dircount;
                uint64_t nextnextdir;

                if (!SeekOK(tif, nextdir) || !ReadOK(tif, &dircount64, 8))
                {
                    TIFFErrorExtR(tif, module,
                                  "Error fetching directory count");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(&dircount64);
                if (dircount64 > 0xFFFF)
                {
                    TIFFErrorExtR(tif, module,
                                  "Sanity check on tag count failed, likely "
                                  "corrupt TIFF");
                    return (0);
                }
                dircount = (uint16_t)dircount64;
                (void)TIFFSeekFile(tif, nextdir + 8 + dircount * 20, SEEK_SET);
                if (!ReadOK(tif, &nextnextdir, 8))
                {
                    TIFFErrorExtR(tif, module, "Error fetching directory link");
                    return (0);
                }
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(&nextnextdir);
                if (nextnextdir == tif->tif_diroff)
                {
                    uint64_t m;
                    m = 0;
                    (void)TIFFSeekFile(tif, nextdir + 8 + dircount * 20,
                                       SEEK_SET);
                    if (!WriteOK(tif, &m, 8))
                    {
                        TIFFErrorExtR(tif, module,
                                      "Error writing directory link");
                        return (0);
                    }
                    tif->tif_diroff = 0;
                    /* Force a full-traversal to reach the zeroed pointer */
                    tif->tif_lastdiroff = 0;
                    break;
                }
                nextdir = nextnextdir;
            }
        }
        /* Remove skipped offset from IFD loop directory list. */
        _TIFFRemoveEntryFromDirectoryListByOffset(tif, torewritediroff);
    }

    /*
     * Now use TIFFWriteDirectory() normally.
     */

    return TIFFWriteDirectory(tif);
}